

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

void __thiscall cfd::capi::CfdCapiManager::FreeHandle(CfdCapiManager *this,void *handle)

{
  int iVar1;
  CfdException *this_00;
  const_iterator __position;
  allocator local_59;
  void *handle_local;
  undefined1 local_50 [32];
  
  if (handle != (void *)0x0) {
    handle_local = handle;
    iVar1 = bcmp(handle,"CapiHandleData",0xf);
    if (iVar1 != 0) {
      local_50._0_8_ = "cfdcapi_common.cpp";
      local_50._8_4_ = 0x164;
      local_50._16_8_ = "FreeHandle";
      core::logger::warn<>((CfdSourceLocation *)local_50,"Illegal handle data. prefix unmatch.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)local_50,"Illegal handle data.",&local_59);
      core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_50);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if (*(char *)((long)handle + 0x14) == '\x01') {
      free(handle);
      return;
    }
    std::mutex::lock(&this->mutex_);
    for (__position._M_current =
              (this->handle_list_).
              super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
        __position._M_current !=
        (this->handle_list_).
        super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
        ._M_impl.super__Vector_impl_data._M_finish;
        __position._M_current = __position._M_current + 1) {
      if (*__position._M_current == (CfdCapiHandleData *)handle) {
        local_50._0_8_ = "cfdcapi_common.cpp";
        local_50._8_4_ = 0x173;
        local_50._16_8_ = "FreeHandle";
        core::logger::info<void*&>
                  ((CfdSourceLocation *)local_50,"capi FreeHandle. addr={:p}.",&handle_local);
        free(handle_local);
        std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
        ::erase(&this->handle_list_,__position);
        break;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  }
  return;
}

Assistant:

void CfdCapiManager::FreeHandle(void* handle) {
  if (handle != nullptr) {
    CfdCapiHandleData* handle_data = static_cast<CfdCapiHandleData*>(handle);
    size_t len = strlen(kPrefixHandleData) + 1;
    if (memcmp(handle_data->prefix, kPrefixHandleData, len) != 0) {
      warn(CFD_LOG_SOURCE, "Illegal handle data. prefix unmatch.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Illegal handle data.");
    }

    if (handle_data->is_outside) {  // outside handle
      memset(handle, 0, sizeof(CfdCapiHandleData));
      ::free(handle);
    } else {
      // 排他制御開始
      std::lock_guard<std::mutex> lock(mutex_);

      std::vector<CfdCapiHandleData*>::iterator ite;
      for (ite = handle_list_.begin(); ite != handle_list_.end(); ++ite) {
        if (handle == *ite) {
          info(CFD_LOG_SOURCE, "capi FreeHandle. addr={:p}.", handle);
          memset(handle, 0, sizeof(CfdCapiHandleData));
          ::free(handle);
          handle_list_.erase(ite);
          break;
        }
      }
    }
  }
}